

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O3

ktx_error_code_e ktxMemStream_construct_ro(ktxStream *str,ktx_uint8_t *bytes,ktx_size_t numBytes)

{
  ktx_error_code_e kVar1;
  ktxMem *pkVar2;
  
  kVar1 = KTX_INVALID_VALUE;
  if (numBytes != 0 && (bytes != (ktx_uint8_t *)0x0 && str != (ktxStream *)0x0)) {
    pkVar2 = (ktxMem *)malloc(0x28);
    if (pkVar2 == (ktxMem *)0x0) {
      kVar1 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar1 = KTX_SUCCESS;
      pkVar2->pos = 0;
      pkVar2->robytes = bytes;
      pkVar2->bytes = (ktx_uint8_t *)0x0;
      pkVar2->used_size = numBytes;
      pkVar2->alloc_size = numBytes;
      (str->data).mem = pkVar2;
      str->type = eStreamTypeMemory;
      str->read = ktxMemStream_read;
      str->skip = ktxMemStream_skip;
      str->write = ktxMemStream_write;
      str->getpos = ktxMemStream_getpos;
      str->setpos = ktxMemStream_setpos;
      str->getsize = ktxMemStream_getsize;
      str->destruct = ktxMemStream_destruct;
      str->closeOnDestruct = false;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code ktxMemStream_construct_ro(ktxStream* str,
                                         const ktx_uint8_t* bytes,
                                         const ktx_size_t numBytes)
{
    ktxMem* mem;
    KTX_error_code result = KTX_SUCCESS;

    if (!str || !bytes || numBytes == 0)
        return KTX_INVALID_VALUE;

    result = ktxMem_create_ro(&mem, bytes, numBytes);

    if (KTX_SUCCESS == result) {
        str->data.mem = mem;
        ktxMemStream_setup(str);
        str->closeOnDestruct = KTX_FALSE;
    }

    return result;
}